

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memload.cpp
# Opt level: O0

int load_raw(char *file_name,char *buf,unsigned_long len)

{
  FILE *__stream;
  size_t sVar1;
  FILE *fp;
  int ret;
  unsigned_long len_local;
  char *buf_local;
  char *file_name_local;
  
  __stream = fopen(file_name,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Failed to open: %s\n",file_name);
    file_name_local._4_4_ = -1;
  }
  else {
    sVar1 = fread(buf,1,len,__stream);
    if ((int)sVar1 < 0) {
      printf("Failed to read file\n");
      fclose(__stream);
      file_name_local._4_4_ = -1;
    }
    else {
      fclose(__stream);
      file_name_local._4_4_ = 0;
    }
  }
  return file_name_local._4_4_;
}

Assistant:

int load_raw(char *file_name, char *buf, unsigned long len)
{
	int ret;
	FILE *fp = fopen(file_name, "rb");
	if (fp == NULL) {
		printf("Failed to open: %s\n", file_name);
		return -1;
	}
	
	ret = fread(buf, 1, len, fp);
	if (ret < 0) {
		printf("Failed to read file\n");
		fclose(fp);
		return -1;
	}
	
	fclose(fp);
	return 0;	
}